

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3RollbackToMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  Fts3Table *p;
  int iSavepoint_local;
  sqlite3_vtab *pVtab_local;
  
  sqlite3Fts3PendingTermsClear((Fts3Table *)pVtab);
  return 0;
}

Assistant:

static int fts3RollbackToMethod(sqlite3_vtab *pVtab, int iSavepoint){
  Fts3Table *p = (Fts3Table*)pVtab;
  UNUSED_PARAMETER(iSavepoint);
  assert( p->inTransaction );
  TESTONLY( p->mxSavepoint = iSavepoint );
  sqlite3Fts3PendingTermsClear(p);
  return SQLITE_OK;
}